

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationResult.cpp
# Opt level: O0

void __thiscall SimulationResult::Print(SimulationResult *this)

{
  uint uVar1;
  size_type sVar2;
  ostream *poVar3;
  void *pvVar4;
  reference pvVar5;
  double *in_RDI;
  uint i;
  uint local_c;
  
  uVar1 = *(uint *)(in_RDI + 5);
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 1));
  if (sVar2 < uVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"SimulationResult::Print error _m_nr_stored ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(uint *)(in_RDI + 5));
    poVar3 = std::operator<<(poVar3," > ");
    poVar3 = std::operator<<(poVar3," _m_rewards.size() ");
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 1));
    pvVar4 = (void *)std::ostream::operator<<(poVar3,sVar2);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"SimulationResult::Print horizon ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(uint *)(in_RDI + 4));
  poVar3 = std::operator<<(poVar3," seed ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)((long)in_RDI + 0x24));
  poVar3 = std::operator<<(poVar3," entries ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,*(uint *)(in_RDI + 5));
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"SimulationResult::Print Rewards: ");
  for (local_c = 0; local_c < *(uint *)(in_RDI + 5); local_c = local_c + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),(ulong)local_c);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar5);
    std::operator<<(poVar3," ");
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"SimulationResult::Print Average reward ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,*in_RDI);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SimulationResult::Print(void)
{
    if(_m_nr_stored>_m_rewards.size())
        cerr << "SimulationResult::Print error _m_nr_stored " << _m_nr_stored  
             << " > " << " _m_rewards.size() " << _m_rewards.size() << endl;

    cout << "SimulationResult::Print horizon " << _m_horizon << " seed "
         << _m_random_seed << " entries " << _m_nr_stored << endl;
    cout << "SimulationResult::Print Rewards: ";
    for(unsigned int i=0;i<_m_nr_stored;i++)
        cout << _m_rewards[i] << " ";
    cout << endl;
    cout << "SimulationResult::Print Average reward " << _m_avg_reward << endl;
}